

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

Node * __thiscall SQCompilation::SymbolInfo::extractPointedNode(SymbolInfo *this)

{
  switch(this->kind) {
  case SK_EXCEPTION:
  case SK_FUNCTION:
  case SK_CLASS:
  case SK_TABLE:
  case SK_VAR:
  case SK_BINDING:
  case SK_CONST:
  case SK_ENUM:
  case SK_PARAM:
  case SK_FOREACH:
  case SK_EXTERNAL_BINDING:
    return (Node *)(this->declarator).x;
  case SK_ENUM_CONST:
    return &((this->declarator).m)->value->super_Node;
  default:
    return (Node *)0x0;
  }
}

Assistant:

const Node *extractPointedNode() const {
    switch (kind)
    {
    case SK_EXCEPTION:
      return declarator.x;
    case SK_FUNCTION:
      return declarator.f;
    case SK_CLASS:
      return declarator.k;
    case SK_TABLE:
      return declarator.t;
    case SK_VAR:
    case SK_BINDING:
    case SK_FOREACH:
      return declarator.v;
    case SK_CONST:
      return declarator.c;
    case SK_ENUM:
      return declarator.e;
    case SK_ENUM_CONST:
      return declarator.ec->val;
    case SK_PARAM:
      return declarator.p;
    case SK_EXTERNAL_BINDING:
      return declarator.ev;
    default:
      assert(0);
      return nullptr;
    }
  }